

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify.cc
# Opt level: O3

void duckdb_re2::CoalesceWalker::DoCoalesce(Regexp **r1ptr,Regexp **r2ptr)

{
  uint uVar1;
  Regexp *this;
  Regexp *this_00;
  int iVar2;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar3;
  Regexp *pRVar4;
  Regexp *this_01;
  int iVar5;
  int iVar6;
  ulong uVar7;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  this = *r1ptr;
  paVar8 = &this->field_5;
  paVar3 = paVar8;
  if (1 < this->nsub_) {
    paVar3 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(this->field_5).submany_;
  }
  this_00 = *r2ptr;
  pRVar4 = Regexp::Incref(paVar3->subone_);
  pRVar4 = Regexp::Repeat(pRVar4,(uint)this->parse_flags_,0,0);
  switch(this->op_) {
  case '\a':
    *(int *)&pRVar4->arguments = -1;
    *(int *)((long)&pRVar4->arguments + 4) = 0;
    iVar5 = 0;
    goto LAB_0049974e;
  case '\b':
    *(int *)&pRVar4->arguments = -1;
    *(int *)((long)&pRVar4->arguments + 4) = 1;
    iVar5 = 1;
LAB_0049974e:
    iVar2 = -1;
    break;
  case '\t':
    *(int *)&pRVar4->arguments = 1;
    *(int *)((long)&pRVar4->arguments + 4) = 0;
    iVar5 = 0;
    iVar2 = 1;
    break;
  case '\n':
    iVar5 = (this->arguments).repeat.min_;
    (pRVar4->arguments).repeat.min_ = iVar5;
    iVar2 = (this->arguments).repeat.max_;
    (pRVar4->arguments).repeat.max_ = iVar2;
    break;
  default:
    Regexp::Decref(pRVar4);
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"DoCoalesce failed: r1->op() is ",0x1f);
    std::ostream::operator<<(local_1a8,(uint)this->op_);
    goto LAB_004998fa;
  }
  switch(this_00->op_) {
  case '\x03':
  case '\f':
  case '\r':
  case '\x14':
    (pRVar4->arguments).repeat.min_ = iVar5 + 1;
  case '\t':
    if (iVar2 != -1) {
      iVar2 = iVar2 + 1;
LAB_00499780:
      (pRVar4->arguments).repeat.max_ = iVar2;
    }
    break;
  case '\x04':
    if (1 < this->nsub_) {
      paVar8 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(this->field_5).submany_;
    }
    uVar1 = (this_00->arguments).repeat.max_;
    uVar7 = 1;
    if (1 < (int)uVar1) {
      uVar7 = 1;
      do {
        if (*(int *)((long)&(((this_00->arguments).capture.name_)->_M_dataplus)._M_p + uVar7 * 4) !=
            (paVar8->subone_->arguments).repeat.max_) goto LAB_00499875;
        uVar7 = uVar7 + 1;
      } while (uVar1 != uVar7);
      uVar7 = (ulong)uVar1;
    }
LAB_00499875:
    iVar6 = (int)uVar7;
    (pRVar4->arguments).repeat.min_ = iVar5 + iVar6;
    if (iVar2 != -1) {
      (pRVar4->arguments).repeat.max_ = iVar2 + iVar6;
    }
    if (iVar6 != (this_00->arguments).repeat.max_) {
      *r1ptr = pRVar4;
      pRVar4 = Regexp::LiteralString
                         ((Rune *)((long)&(((this_00->arguments).capture.name_)->_M_dataplus)._M_p +
                                  (uVar7 & 0xffffffff) * 4),(this_00->arguments).repeat.max_ - iVar6
                          ,(uint)this_00->parse_flags_);
      goto LAB_00499818;
    }
    break;
  default:
    Regexp::Decref(pRVar4);
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"DoCoalesce failed: r2->op() is ",0x1f);
    std::ostream::operator<<(local_1a8,(uint)this_00->op_);
LAB_004998fa:
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
    return;
  case '\b':
    (pRVar4->arguments).repeat.min_ = iVar5 + 1;
  case '\a':
switchD_00499771_caseD_7:
    (pRVar4->arguments).repeat.max_ = -1;
    break;
  case '\n':
    (pRVar4->arguments).repeat.min_ = iVar5 + (this_00->arguments).repeat.min_;
    iVar5 = (this_00->arguments).repeat.max_;
    if (iVar5 == -1) goto switchD_00499771_caseD_7;
    if (iVar2 == -1) break;
    iVar2 = iVar2 + iVar5;
    goto LAB_00499780;
  }
  this_01 = (Regexp *)operator_new(0x28);
  Regexp::Regexp(this_01,kRegexpEmptyMatch,NoParseFlags);
  *r1ptr = this_01;
LAB_00499818:
  *r2ptr = pRVar4;
  Regexp::Decref(this);
  Regexp::Decref(this_00);
  return;
}

Assistant:

void CoalesceWalker::DoCoalesce(Regexp** r1ptr, Regexp** r2ptr) {
  Regexp* r1 = *r1ptr;
  Regexp* r2 = *r2ptr;

  Regexp* nre = Regexp::Repeat(
      r1->sub()[0]->Incref(), r1->parse_flags(), 0, 0);

  switch (r1->op()) {
    case kRegexpStar:
      nre->arguments.repeat.min_ = 0;
      nre->arguments.repeat.max_ = -1;
      break;

    case kRegexpPlus:
      nre->arguments.repeat.min_ = 1;
      nre->arguments.repeat.max_ = -1;
      break;

    case kRegexpQuest:
      nre->arguments.repeat.min_ = 0;
      nre->arguments.repeat.max_ = 1;
      break;

    case kRegexpRepeat:
      nre->arguments.repeat.min_ = r1->min();
      nre->arguments.repeat.max_ = r1->max();
      break;

    default:
      nre->Decref();
      LOG(DFATAL) << "DoCoalesce failed: r1->op() is " << r1->op();
      return;
  }

  switch (r2->op()) {
    case kRegexpStar:
      nre->arguments.repeat.max_ = -1;
      goto LeaveEmpty;

    case kRegexpPlus:
      nre->arguments.repeat.min_++;
      nre->arguments.repeat.max_ = -1;
      goto LeaveEmpty;

    case kRegexpQuest:
      if (nre->max() != -1)
        nre->arguments.repeat.max_++;
      goto LeaveEmpty;

    case kRegexpRepeat:
      nre->arguments.repeat.min_ += r2->min();
      if (r2->max() == -1)
        nre->arguments.repeat.max_ = -1;
      else if (nre->max() != -1)
        nre->arguments.repeat.max_ += r2->max();
      goto LeaveEmpty;

    case kRegexpLiteral:
    case kRegexpCharClass:
    case kRegexpAnyChar:
    case kRegexpAnyByte:
      nre->arguments.repeat.min_++;
      if (nre->max() != -1)
        nre->arguments.repeat.max_++;
      goto LeaveEmpty;

    LeaveEmpty:
      *r1ptr = new Regexp(kRegexpEmptyMatch, Regexp::NoParseFlags);
      *r2ptr = nre;
      break;

    case kRegexpLiteralString: {
      Rune r = r1->sub()[0]->rune();
      // Determine how much of the literal string is removed.
      // We know that we have at least one rune. :)
      int n = 1;
      while (n < r2->nrunes() && r2->runes()[n] == r)
        n++;
      nre->arguments.repeat.min_ += n;
      if (nre->max() != -1)
        nre->arguments.repeat.max_ += n;
      if (n == r2->nrunes())
        goto LeaveEmpty;
      *r1ptr = nre;
      *r2ptr = Regexp::LiteralString(
          &r2->runes()[n], r2->nrunes() - n, r2->parse_flags());
      break;
    }

    default:
      nre->Decref();
      LOG(DFATAL) << "DoCoalesce failed: r2->op() is " << r2->op();
      return;
  }

  r1->Decref();
  r2->Decref();
}